

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

int __thiscall
mkvmuxer::Segment::TestFrame
          (Segment *this,uint64_t track_number,uint64_t frame_timestamp_ns,bool is_key)

{
  Cluster *this_00;
  bool bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  byte in_CL;
  ulong in_RDX;
  long in_RDI;
  uint64_t cluster_size;
  uint64_t delta_ns;
  int64_t delta_timecode;
  uint64_t last_cluster_timecode;
  Cluster *last_cluster;
  uint64_t frame_timecode;
  uint64_t timecode_scale;
  uint64_t in_stack_ffffffffffffffa0;
  Tracks *in_stack_ffffffffffffffa8;
  int local_4;
  
  if ((*(byte *)(in_RDI + 0x128) & 1) == 0) {
    if (*(int *)(in_RDI + 0x114) < 1) {
      local_4 = 1;
    }
    else {
      uVar2 = SegmentInfo::timecode_scale((SegmentInfo *)(in_RDI + 0x68));
      this_00 = *(Cluster **)(*(long *)(in_RDI + 0x108) + (long)(*(int *)(in_RDI + 0x114) + -1) * 8)
      ;
      uVar3 = Cluster::timecode(this_00);
      if (in_RDX / uVar2 < uVar3) {
        local_4 = -1;
      }
      else {
        lVar4 = in_RDX / uVar2 - uVar3;
        if (lVar4 < 0x8000) {
          if (((in_CL & 1) == 0) ||
             (bVar1 = Tracks::TrackIsVideo(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0),
             !bVar1)) {
            if ((*(long *)(in_RDI + 0x938) == 0) || (lVar4 * uVar2 < *(ulong *)(in_RDI + 0x938))) {
              uVar2 = Cluster::payload_size(this_00);
              if ((*(long *)(in_RDI + 0x940) == 0) || (uVar2 < *(ulong *)(in_RDI + 0x940))) {
                local_4 = 0;
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 2;
        }
      }
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Segment::TestFrame(uint64_t track_number, uint64_t frame_timestamp_ns,
                       bool is_key) const {
  if (force_new_cluster_)
    return 1;

  // If no clusters have been created yet, then create a new cluster
  // and write this frame immediately, in the new cluster.  This path
  // should only be followed once, the first time we attempt to write
  // a frame.

  if (cluster_list_size_ <= 0)
    return 1;

  // There exists at least one cluster. We must compare the frame to
  // the last cluster, in order to determine whether the frame is
  // written to the existing cluster, or that a new cluster should be
  // created.

  const uint64_t timecode_scale = segment_info_.timecode_scale();
  const uint64_t frame_timecode = frame_timestamp_ns / timecode_scale;

  const Cluster* const last_cluster = cluster_list_[cluster_list_size_ - 1];
  const uint64_t last_cluster_timecode = last_cluster->timecode();

  // For completeness we test for the case when the frame's timecode
  // is less than the cluster's timecode.  Although in principle that
  // is allowed, this muxer doesn't actually write clusters like that,
  // so this indicates a bug somewhere in our algorithm.

  if (frame_timecode < last_cluster_timecode)  // should never happen
    return -1;

  // If the frame has a timestamp significantly larger than the last
  // cluster (in Matroska, cluster-relative timestamps are serialized
  // using a 16-bit signed integer), then we cannot write this frame
  // to that cluster, and so we must create a new cluster.

  const int64_t delta_timecode = frame_timecode - last_cluster_timecode;

  if (delta_timecode > kMaxBlockTimecode)
    return 2;

  // We decide to create a new cluster when we have a video keyframe.
  // This will flush queued (audio) frames, and write the keyframe
  // immediately, in the newly-created cluster.

  if (is_key && tracks_.TrackIsVideo(track_number))
    return 1;

  // Create a new cluster if we have accumulated too many frames
  // already, where "too many" is defined as "the total time of frames
  // in the cluster exceeds a threshold".

  const uint64_t delta_ns = delta_timecode * timecode_scale;

  if (max_cluster_duration_ > 0 && delta_ns >= max_cluster_duration_)
    return 1;

  // This is similar to the case above, with the difference that a new
  // cluster is created when the size of the current cluster exceeds a
  // threshold.

  const uint64_t cluster_size = last_cluster->payload_size();

  if (max_cluster_size_ > 0 && cluster_size >= max_cluster_size_)
    return 1;

  // There's no need to create a new cluster, so emit this frame now.

  return 0;
}